

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_xml.cc
# Opt level: O0

void __thiscall iqxmlrpc::Value_type_to_xml::do_visit_int(Value_type_to_xml *this,int val)

{
  int *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  Value_type_to_xml *pVStack_10;
  int val_local;
  Value_type_to_xml *this_local;
  
  local_14 = val;
  pVStack_10 = this;
  boost::lexical_cast<std::__cxx11::string,int>(&local_38,(boost *)&local_14,in_RDX);
  add_textnode(this,"i4",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Value_type_to_xml::do_visit_int(int val)
{
  add_textnode("i4", boost::lexical_cast<std::string>(val));
}